

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FillLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_filllike(NeuralNetworkLayer *this)

{
  FillLikeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x438) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x438;
    this_00 = (FillLikeLayerParams *)operator_new(0x18);
    FillLikeLayerParams::FillLikeLayerParams(this_00);
    (this->layer_).filllike_ = this_00;
  }
  return (FillLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FillLikeLayerParams* NeuralNetworkLayer::mutable_filllike() {
  if (!has_filllike()) {
    clear_layer();
    set_has_filllike();
    layer_.filllike_ = new ::CoreML::Specification::FillLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillLike)
  return layer_.filllike_;
}